

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O2

void __thiscall
libtorrent::session_handle::async_add_torrent(session_handle *this,add_torrent_params *params)

{
  info_hash_t *this_00;
  undefined8 uVar1;
  bool bVar2;
  add_torrent_params *this_01;
  char *in_RCX;
  element_type *peVar3;
  string_view f;
  scope_end_impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_handle_cpp:429:31)>
  guard;
  add_torrent_params *p;
  scope_end_impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_handle_cpp:429:31)>
  local_58;
  add_torrent_params *local_48;
  undefined1 local_40 [32];
  
  this_00 = &params->info_hashes;
  bVar2 = info_hash_t::has_v1(this_00);
  if (bVar2) {
    peVar3 = (params->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  }
  else {
    bVar2 = info_hash_t::has_v2(this_00);
    peVar3 = (params->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    in_RCX = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),peVar3 != (element_type *)0x0 || bVar2);
    if (peVar3 == (element_type *)0x0 && !bVar2) {
      (params->info_hashes).v1.m_number._M_elems[4] = (params->info_hash).m_number._M_elems[4];
      uVar1 = *(undefined8 *)((params->info_hash).m_number._M_elems + 2);
      *(undefined8 *)(this_00->v1).m_number._M_elems =
           *(undefined8 *)(params->info_hash).m_number._M_elems;
      *(undefined8 *)((params->info_hashes).v1.m_number._M_elems + 2) = uVar1;
      goto LAB_00277de4;
    }
  }
  if (peVar3 != (element_type *)0x0) {
    ::std::make_shared<libtorrent::torrent_info,libtorrent::torrent_info&>((torrent_info *)local_40)
    ;
    ::std::__shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(params->ti).
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2> *)local_40);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  }
LAB_00277de4:
  this_01 = (add_torrent_params *)operator_new(0x350);
  add_torrent_params::add_torrent_params(this_01,params);
  local_58.m_armed = true;
  f._M_str = in_RCX;
  f._M_len = (size_t)(this_01->save_path)._M_dataplus._M_p;
  local_58.m_fun.p = this_01;
  local_48 = this_01;
  complete_abi_cxx11_((string *)local_40,(libtorrent *)(this_01->save_path)._M_string_length,f);
  ::std::__cxx11::string::operator=((string *)&this_01->save_path,(string *)local_40);
  ::std::__cxx11::string::~string((string *)local_40);
  async_call<void(libtorrent::aux::session_impl::*)(libtorrent::add_torrent_params*),libtorrent::add_torrent_params*&>
            (this,0x294a30,(add_torrent_params **)0x0);
  local_58.m_armed = false;
  aux::
  scope_end_impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_handle.cpp:429:31)>
  ::~scope_end_impl(&local_58);
  return;
}

Assistant:

void session_handle::async_add_torrent(add_torrent_params&& params)
	{
		TORRENT_ASSERT_PRECOND(!params.save_path.empty());

#if TORRENT_ABI_VERSION < 3
		if (!params.info_hashes.has_v1() && !params.info_hashes.has_v2() && !params.ti)
			params.info_hashes.v1 = params.info_hash;
#endif

		// the internal torrent object keeps and mutates state in the
		// torrent_info object. We can't let that leak back to the client
		if (params.ti)
			params.ti = std::make_shared<torrent_info>(*params.ti);

		// we cannot capture a unique_ptr into a lambda in c++11, so we use a raw
		// pointer for now. async_call uses a lambda expression to post the call
		// to the main thread
		// TODO: in C++14, use unique_ptr and move it into the lambda
		auto* p = new add_torrent_params(std::move(params));
		auto guard = aux::scope_end([p]{ delete p; });
		p->save_path = complete(p->save_path);

#if TORRENT_ABI_VERSION == 1
		handle_backwards_compatible_resume_data(*p);
#endif

		async_call(&session_impl::async_add_torrent, p);
		guard.disarm();
	}